

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

Input * __thiscall
helics::ValueFederateManager::registerInput
          (ValueFederateManager *this,string_view key,string_view type,string_view units)

{
  string_view message;
  string_view searchValue1;
  bool bVar1;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5> *pDVar2;
  Input *pIVar3;
  reference pvVar4;
  unsigned_long *puVar5;
  char *__str;
  char *in_RDX;
  size_t in_RSI;
  ValueFederate **in_RDI;
  optional<unsigned_long> oVar6;
  value_type *idat;
  handle datHandle;
  Input *ref;
  optional<unsigned_long> active;
  handle inpHandle;
  InterfaceHandle coreID;
  basic_string_view<char,_std::char_traits<char>_> *__args_2;
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  *plVar7;
  InterfaceHandle *in_stack_fffffffffffffed8;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  pointer in_stack_fffffffffffffef0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  string_view in_stack_ffffffffffffff28;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_98;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  uint local_50;
  int local_4c [5];
  string_view local_38;
  size_t local_20;
  char *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  plVar7 = (lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
            *)&stack0x00000008;
  local_10._M_len = in_RSI;
  local_10._M_str = in_RDX;
  if (((ulong)*in_RDI & 1) == 0) {
    local_38 = getCleanedTypeName(in_stack_ffffffffffffff28);
  }
  else {
    local_38._M_str = "json";
    local_38._M_len = 4;
  }
  local_20 = local_38._M_len;
  local_18 = local_38._M_str;
  local_50 = *(uint *)((long)in_RDI + 4);
  local_60 = local_10._M_len;
  local_58 = local_10._M_str;
  local_70 = local_38._M_len;
  local_68 = local_38._M_str;
  __args_2 = (basic_string_view<char,_std::char_traits<char>_> *)plVar7->data;
  this_00 = (lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
             *)(plVar7->m_handle_lock)._M_device;
  local_80 = __args_2;
  local_78 = this_00;
  local_4c[0] = (*in_RDI[0x40]->_vptr_ValueFederate[0x26])
                          (in_RDI[0x40],(ulong)local_50,local_10._M_len,local_10._M_str,
                           local_38._M_len,local_38._M_str);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
          *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x29fec7);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    pDVar2 = gmlc::libguarded::
             lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
             ::operator->(&local_98);
    gmlc::containers::
    DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
    insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              (pDVar2,local_4c,in_RDI + 0x41,local_4c,&local_10,plVar7);
  }
  else {
    this_00 = plVar7;
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::operator->(&local_98);
    __args_2 = &local_10;
    searchValue1._M_str = (char *)in_stack_fffffffffffffef0;
    searchValue1._M_len = in_stack_fffffffffffffee8;
    oVar6 = gmlc::containers::
            DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
            insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      (in_stack_fffffffffffffee0,searchValue1,in_stack_fffffffffffffed8,in_RDI,
                       (InterfaceHandle *)this_00,in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff18);
    in_stack_fffffffffffffebf =
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x2a0029);
  if (!bVar1) {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe90,__str);
    message._M_str = in_stack_fffffffffffffea0;
    message._M_len = in_stack_fffffffffffffe98;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffffe90,message);
    __cxa_throw(__str,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(&local_98);
  pIVar3 = gmlc::containers::
           DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
           ::back((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                   *)0x2a0047);
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  ::lock((shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
          *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  gmlc::libguarded::
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  ::operator->((lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
                *)&stack0xfffffffffffffef0);
  pvVar4 = std::deque<helics::InputData,std::allocator<helics::InputData>>::
           emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                     ((deque<helics::InputData,_std::allocator<helics::InputData>_> *)
                      in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      (basic_string_view<char,_std::char_traits<char>_> *)this_00,__args_2);
  pIVar3->dataReference = pvVar4;
  gmlc::libguarded::
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  ::unlock(this_00);
  puVar5 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x2a00d5);
  pIVar3->referenceIndex = (int)*puVar5;
  if (((ulong)*in_RDI & 1) != 0) {
    pIVar3->targetType = HELICS_JSON;
  }
  gmlc::libguarded::
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  ::~lock_handle((lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
                  *)0x2a013a);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x2a0147);
  return pIVar3;
}

Assistant:

Input& ValueFederateManager::registerInput(std::string_view key,
                                           std::string_view type,
                                           std::string_view units)
{
    type = useJsonSerialization ? jsonStringType : getCleanedTypeName(type);
    auto coreID = coreObject->registerInput(fedID, key, type, units);
    auto inpHandle = inputs.lock();
    decltype(inpHandle->insert(key, coreID, fed, coreID, key, units)) active;
    if (!key.empty()) {
        active = inpHandle->insert(key, coreID, fed, coreID, key, units);
    } else {
        active = inpHandle->insert(no_search, coreID, fed, coreID, key, units);
    }
    if (active) {
        auto& ref = inpHandle->back();
        auto datHandle = inputData.lock();
        auto& idat = datHandle->emplace_back(key, type, units);

        // non-owning pointer
        ref.dataReference = &idat;
        datHandle.unlock();
        ref.referenceIndex = static_cast<int>(*active);
        if (useJsonSerialization) {
            ref.targetType = DataType::HELICS_JSON;
        }
        return ref;
    }
    throw(RegistrationFailure("Unable to register Input"));
}